

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindExtensionByCamelcaseName(Descriptor *this,string *key)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  FieldDescriptor *result;
  string *key_local;
  Descriptor *this_local;
  
  pFVar2 = file(this);
  this_local = (Descriptor *)
               FileDescriptorTables::FindFieldByCamelcaseName
                         (*(FileDescriptorTables **)(pFVar2 + 0xa8),this,key);
  if ((this_local == (Descriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)this_local), !bVar1)) {
    this_local = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor*
Descriptor::FindExtensionByCamelcaseName(const string& key) const {
  const FieldDescriptor* result =
    file()->tables_->FindFieldByCamelcaseName(this, key);
  if (result == NULL || !result->is_extension()) {
    return NULL;
  } else {
    return result;
  }
}